

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_2_4_True(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  float *data;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  float *pfVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  float *pfVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  ulong uVar44;
  int iVar45;
  int k_count;
  int iVar46;
  long lVar47;
  int scale;
  long lVar48;
  int iVar49;
  float *pfVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  undefined1 auVar86 [12];
  undefined1 auVar85 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  undefined1 auVar90 [64];
  int data_width;
  int local_d0;
  
  auVar59._8_4_ = 0x3effffff;
  auVar59._0_8_ = 0x3effffff3effffff;
  auVar59._12_4_ = 0x3effffff;
  auVar85 = ZEXT1664(auVar59);
  auVar58._8_4_ = 0x80000000;
  auVar58._0_8_ = 0x8000000080000000;
  auVar58._12_4_ = 0x80000000;
  fVar64 = ipoint->scale;
  auVar90 = ZEXT464((uint)fVar64);
  auVar51 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)fVar64),auVar58,0xf8);
  auVar51 = ZEXT416((uint)(fVar64 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  fVar63 = -0.08 / (fVar64 * fVar64);
  scale = (int)auVar51._0_4_;
  auVar52._0_4_ = (int)auVar51._0_4_;
  auVar52._4_4_ = (int)auVar51._4_4_;
  auVar52._8_4_ = (int)auVar51._8_4_;
  auVar52._12_4_ = (int)auVar51._12_4_;
  auVar51 = vcvtdq2ps_avx(auVar52);
  auVar52 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)ipoint->x),auVar58,0xf8);
  auVar52 = ZEXT416((uint)(ipoint->x + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53._0_8_ = (double)auVar52._0_4_;
  auVar53._8_8_ = auVar52._8_8_;
  auVar57._0_8_ = (double)fVar64;
  auVar57._8_8_ = 0;
  auVar52 = vfmadd231sd_fma(auVar53,auVar57,ZEXT816(0x3fe0000000000000));
  auVar56._0_4_ = (float)auVar52._0_8_;
  auVar56._4_12_ = auVar52._4_12_;
  auVar52 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)ipoint->y),auVar58,0xf8);
  fVar5 = auVar56._0_4_ - auVar51._0_4_;
  auVar52 = ZEXT416((uint)(ipoint->y + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar54._0_8_ = (double)auVar52._0_4_;
  auVar54._8_8_ = auVar52._8_8_;
  auVar52 = vfmadd231sd_fma(auVar54,auVar57,ZEXT816(0x3fe0000000000000));
  auVar55._0_4_ = (float)auVar52._0_8_;
  auVar55._4_12_ = auVar52._4_12_;
  fVar89 = auVar55._0_4_ - auVar51._0_4_;
  auVar51 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar64),auVar56);
  auVar52 = vpternlogd_avx512vl(auVar59,auVar51,auVar58,0xf8);
  auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = ZEXT416((uint)fVar64);
  if (scale < (int)auVar51._0_4_) {
    auVar60._8_4_ = 0x3effffff;
    auVar60._0_8_ = 0x3effffff3effffff;
    auVar60._12_4_ = 0x3effffff;
    auVar61._8_4_ = 0x80000000;
    auVar61._0_8_ = 0x8000000080000000;
    auVar61._12_4_ = 0x80000000;
    auVar51 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar52,auVar55);
    auVar53 = vpternlogd_avx512vl(auVar61,auVar51,auVar60,0xea);
    auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar53._0_4_));
    auVar51 = vroundss_avx(auVar51,auVar51,0xb);
    if (scale < (int)auVar51._0_4_) {
      auVar51 = vfmadd231ss_fma(auVar56,auVar52,ZEXT416(0x41300000));
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      auVar53 = vpternlogd_avx512vl(auVar62,auVar51,auVar60,0xea);
      auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar53._0_4_));
      auVar51 = vroundss_avx(auVar51,auVar51,0xb);
      if ((int)auVar51._0_4_ + scale <= iimage->width) {
        auVar51 = vfmadd231ss_fma(auVar55,auVar52,ZEXT416(0x41300000));
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar53 = vpternlogd_avx512vl(auVar60,auVar51,auVar14,0xf8);
        auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar53._0_4_));
        auVar51 = vroundss_avx(auVar51,auVar51,0xb);
        if ((int)auVar51._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar40 = iimage->data;
          fVar5 = fVar5 + 0.5;
          iVar49 = scale * 2;
          pfVar35 = haarResponseY + 0x1b;
          pfVar50 = haarResponseX + 0x1b;
          uVar21 = 0xfffffff4;
          do {
            auVar51._0_4_ = (float)(int)uVar21;
            auVar51._4_12_ = in_ZMM8._4_12_;
            auVar82._0_4_ = (float)(int)(uVar21 | 1);
            auVar82._4_12_ = in_ZMM8._4_12_;
            auVar51 = vfmadd213ss_fma(auVar51,auVar52,ZEXT416((uint)(fVar89 + 0.5)));
            auVar53 = vfmadd213ss_fma(auVar82,auVar52,ZEXT416((uint)(fVar89 + 0.5)));
            iVar17 = (int)auVar51._0_4_;
            iVar24 = (int)auVar53._0_4_;
            iVar18 = (iVar17 + -1) * iVar2;
            iVar16 = (iVar17 + -1 + scale) * iVar2;
            iVar20 = (iVar17 + -1 + iVar49) * iVar2;
            iVar19 = (iVar24 + -1 + iVar49) * iVar2;
            iVar25 = (iVar24 + -1) * iVar2;
            iVar17 = (iVar24 + -1 + scale) * iVar2;
            lVar30 = 0;
            do {
              iVar24 = (int)lVar30;
              auVar76._0_4_ = (float)(iVar24 + -0xc);
              auVar86 = auVar85._4_12_;
              auVar76._4_12_ = auVar86;
              auVar83._0_4_ = (float)(iVar24 + -10);
              auVar83._4_12_ = auVar86;
              auVar51 = vfmadd213ss_fma(auVar76,auVar52,ZEXT416((uint)fVar5));
              auVar53 = vfmadd213ss_fma(auVar83,auVar52,ZEXT416((uint)fVar5));
              iVar34 = (int)auVar51._0_4_;
              auVar77._0_4_ = (float)(iVar24 + -0xb);
              auVar77._4_12_ = auVar86;
              auVar51 = vfmadd213ss_fma(auVar77,auVar52,ZEXT416((uint)fVar5));
              iVar26 = (int)auVar51._0_4_;
              auVar78._0_4_ = (float)(iVar24 + -9);
              auVar78._4_12_ = auVar86;
              iVar27 = iVar34 + -1 + scale;
              auVar51 = vfmadd213ss_fma(auVar78,auVar52,ZEXT416((uint)fVar5));
              iVar32 = iVar34 + -1 + iVar49;
              fVar64 = pfVar40[iVar20 + -1 + iVar34];
              fVar67 = pfVar40[iVar18 + iVar32];
              auVar56 = SUB6416(ZEXT464(0x40000000),0);
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar27] -
                                                      pfVar40[iVar20 + iVar27])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar20 + iVar32] -
                                                      pfVar40[iVar18 + -1 + iVar34])));
              auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar16 + -1 + iVar34] -
                                                      pfVar40[iVar16 + iVar32])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar20 + iVar32] -
                                                      pfVar40[iVar18 + -1 + iVar34])));
              pfVar50[lVar30 + -0x1b] = (fVar64 - fVar67) + auVar54._0_4_;
              pfVar35[lVar30 + -0x1b] = auVar55._0_4_ - (fVar64 - fVar67);
              in_ZMM8 = ZEXT464((uint)pfVar40[iVar32 + iVar19]);
              iVar37 = (int)auVar53._0_4_;
              fVar64 = pfVar40[iVar19 + -1 + iVar34];
              fVar67 = pfVar40[iVar25 + iVar32];
              iVar39 = iVar26 + -1 + iVar49;
              auVar54 = ZEXT416((uint)(pfVar40[iVar32 + iVar19] - pfVar40[iVar25 + -1 + iVar34]));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar25 + iVar27] -
                                                      pfVar40[iVar27 + iVar19])),auVar56,auVar54);
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar17 + -1 + iVar34] -
                                                      pfVar40[iVar17 + iVar32])),auVar56,auVar54);
              pfVar50[lVar30 + -3] = (fVar64 - fVar67) + auVar53._0_4_;
              pfVar35[lVar30 + -3] = auVar54._0_4_ - (fVar64 - fVar67);
              iVar34 = iVar26 + -1 + scale;
              fVar64 = pfVar40[iVar20 + -1 + iVar26];
              fVar67 = pfVar40[iVar18 + iVar39];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar34] -
                                                      pfVar40[iVar20 + iVar34])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar20 + iVar39] -
                                                      pfVar40[iVar18 + -1 + iVar26])));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar16 + -1 + iVar26] -
                                                      pfVar40[iVar16 + iVar39])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar20 + iVar39] -
                                                      pfVar40[iVar18 + -1 + iVar26])));
              pfVar50[lVar30 + -0x1a] = (fVar64 - fVar67) + auVar53._0_4_;
              pfVar35[lVar30 + -0x1a] = auVar54._0_4_ - (fVar64 - fVar67);
              auVar85 = ZEXT464((uint)pfVar40[iVar39 + iVar19]);
              iVar36 = (int)auVar51._0_4_;
              fVar64 = pfVar40[iVar19 + -1 + iVar26];
              iVar27 = iVar37 + -1 + scale;
              fVar67 = pfVar40[iVar25 + iVar39];
              iVar32 = iVar37 + -1 + iVar49;
              auVar53 = ZEXT416((uint)(pfVar40[iVar39 + iVar19] - pfVar40[iVar25 + -1 + iVar26]));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar25 + iVar34] -
                                                      pfVar40[iVar34 + iVar19])),auVar56,auVar53);
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar17 + -1 + iVar26] -
                                                      pfVar40[iVar17 + iVar39])),auVar56,auVar53);
              pfVar50[lVar30 + -2] = (fVar64 - fVar67) + auVar51._0_4_;
              pfVar35[lVar30 + -2] = auVar53._0_4_ - (fVar64 - fVar67);
              fVar64 = pfVar40[iVar20 + -1 + iVar37];
              fVar67 = pfVar40[iVar18 + iVar32];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar27] -
                                                      pfVar40[iVar20 + iVar27])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar20 + iVar32] -
                                                      pfVar40[iVar18 + -1 + iVar37])));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar16 + -1 + iVar37] -
                                                      pfVar40[iVar16 + iVar32])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar20 + iVar32] -
                                                      pfVar40[iVar18 + -1 + iVar37])));
              pfVar50[lVar30 + -0x19] = (fVar64 - fVar67) + auVar51._0_4_;
              pfVar35[lVar30 + -0x19] = auVar53._0_4_ - (fVar64 - fVar67);
              fVar64 = pfVar40[iVar19 + -1 + iVar37];
              fVar67 = pfVar40[iVar25 + iVar32];
              iVar26 = iVar36 + -1 + scale;
              iVar34 = iVar36 + -1 + iVar49;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar25 + iVar27] -
                                                      pfVar40[iVar27 + iVar19])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar32 + iVar19] -
                                                      pfVar40[iVar25 + -1 + iVar37])));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar17 + -1 + iVar37] -
                                                      pfVar40[iVar17 + iVar32])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar32 + iVar19] -
                                                      pfVar40[iVar25 + -1 + iVar37])));
              pfVar50[lVar30 + -1] = (fVar64 - fVar67) + auVar51._0_4_;
              pfVar35[lVar30 + -1] = auVar53._0_4_ - (fVar64 - fVar67);
              fVar64 = pfVar40[iVar20 + -1 + iVar36];
              fVar67 = pfVar40[iVar18 + iVar34];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar26] -
                                                      pfVar40[iVar20 + iVar26])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar20 + iVar34] -
                                                      pfVar40[iVar18 + -1 + iVar36])));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar16 + -1 + iVar36] -
                                                      pfVar40[iVar16 + iVar34])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar20 + iVar34] -
                                                      pfVar40[iVar18 + -1 + iVar36])));
              pfVar50[lVar30 + -0x18] = (fVar64 - fVar67) + auVar51._0_4_;
              pfVar35[lVar30 + -0x18] = auVar53._0_4_ - (fVar64 - fVar67);
              fVar64 = pfVar40[iVar19 + -1 + iVar36];
              fVar67 = pfVar40[iVar25 + iVar34];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar25 + iVar26] -
                                                      pfVar40[iVar26 + iVar19])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar34 + iVar19] -
                                                      pfVar40[iVar25 + -1 + iVar36])));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar17 + -1 + iVar36] -
                                                      pfVar40[iVar17 + iVar34])),auVar56,
                                        ZEXT416((uint)(pfVar40[iVar34 + iVar19] -
                                                      pfVar40[iVar25 + -1 + iVar36])));
              pfVar50[lVar30] = (fVar64 - fVar67) + auVar51._0_4_;
              pfVar35[lVar30] = auVar53._0_4_ - (fVar64 - fVar67);
              lVar30 = lVar30 + 4;
            } while (iVar24 + -0xc < 8);
            pfVar35 = pfVar35 + 0x30;
            pfVar50 = pfVar50 + 0x30;
            bVar4 = (int)uVar21 < 10;
            uVar21 = uVar21 + 2;
          } while (bVar4);
          goto LAB_001b627e;
        }
      }
    }
  }
  iVar2 = scale * 2;
  lVar30 = 0;
  uVar21 = 0xfffffff4;
  do {
    auVar65._0_4_ = (float)(int)uVar21;
    auVar65._4_12_ = in_ZMM8._4_12_;
    auVar68._0_4_ = (float)(int)(uVar21 | 1);
    auVar68._4_12_ = in_ZMM8._4_12_;
    auVar51 = vfmadd213ss_fma(auVar65,auVar90._0_16_,ZEXT416((uint)fVar89));
    auVar53 = vfmadd213ss_fma(auVar68,auVar90._0_16_,ZEXT416((uint)fVar89));
    fVar64 = auVar51._0_4_;
    fVar67 = auVar53._0_4_;
    iVar18 = (int)((double)((ulong)(0.0 <= fVar64) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar64) * -0x4020000000000000) + (double)fVar64);
    iVar24 = iVar2 + iVar18;
    iVar25 = iVar18 + -1;
    iVar26 = iVar18 + -1 + scale;
    iVar19 = iVar2 + -1 + iVar18;
    iVar16 = (int)((double)((ulong)(0.0 <= fVar67) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar67) * -0x4020000000000000) + (double)fVar67);
    iVar20 = iVar2 + iVar16;
    iVar34 = iVar16 + -1;
    iVar27 = iVar16 + -1 + scale;
    iVar17 = iVar2 + -1 + iVar16;
    pfVar40 = haarResponseX;
    pfVar50 = haarResponseY;
    lVar29 = lVar30;
    iVar49 = -0xc;
    do {
      auVar66._0_4_ = (float)iVar49;
      auVar86 = in_ZMM8._4_12_;
      auVar66._4_12_ = auVar86;
      auVar55 = auVar90._0_16_;
      auVar51 = vfmadd213ss_fma(auVar66,auVar55,ZEXT416((uint)fVar5));
      auVar80._0_4_ = (float)(iVar49 + 1);
      auVar80._4_12_ = auVar86;
      auVar74._0_4_ = (float)(iVar49 + 2);
      auVar74._4_12_ = auVar86;
      auVar71._0_4_ = (float)(iVar49 + 3);
      auVar71._4_12_ = auVar86;
      auVar53 = vfmadd213ss_fma(auVar80,auVar55,ZEXT416((uint)fVar5));
      auVar54 = vfmadd213ss_fma(auVar74,auVar55,ZEXT416((uint)fVar5));
      auVar55 = vfmadd213ss_fma(auVar71,auVar55,ZEXT416((uint)fVar5));
      fVar64 = auVar51._0_4_;
      fVar79 = auVar53._0_4_;
      fVar67 = auVar55._0_4_;
      fVar73 = auVar54._0_4_;
      iVar32 = (int)((double)((ulong)(0.0 <= fVar64) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar64) * -0x4020000000000000) + (double)fVar64);
      if (((iVar18 < 1) || (iVar32 < 1)) || (iimage->height < iVar24)) {
LAB_001b58e6:
        haarXY(iimage,iVar18,iVar32,scale,(float *)((long)pfVar40 + lVar29),
               (float *)((long)pfVar50 + lVar29));
        iVar39 = iimage->width;
        pfVar40 = haarResponseX;
        pfVar50 = haarResponseY;
      }
      else {
        iVar39 = iimage->width;
        iVar36 = iVar2 + iVar32;
        if (iVar39 < iVar36) goto LAB_001b58e6;
        iVar37 = iimage->data_width;
        iVar45 = iVar32 + -1 + scale;
        pfVar35 = iimage->data;
        iVar46 = iVar37 * iVar25;
        iVar43 = iVar37 * iVar19;
        fVar64 = pfVar35[iVar43 + -1 + iVar32];
        fVar6 = pfVar35[iVar46 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar46 + iVar45] - pfVar35[iVar43 + iVar45]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar35[iVar43 + -1 + iVar36] -
                                                pfVar35[iVar46 + -1 + iVar32])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar37 * iVar26 + -1 + iVar32] -
                                                pfVar35[iVar37 * iVar26 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar35[iVar43 + -1 + iVar36] -
                                                pfVar35[iVar46 + -1 + iVar32])));
        *(float *)((long)pfVar40 + lVar29) = (fVar64 - fVar6) + auVar51._0_4_;
        *(float *)((long)pfVar50 + lVar29) = auVar53._0_4_ - (fVar64 - fVar6);
      }
      pfVar35 = (float *)((long)pfVar40 + lVar29 + 0x60);
      pfVar1 = (float *)((long)pfVar50 + lVar29 + 0x60);
      if (((iVar16 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar20 || (iVar36 = iVar2 + iVar32, iVar39 < iVar36)))) {
        haarXY(iimage,iVar16,iVar32,scale,pfVar35,pfVar1);
        iVar39 = iimage->width;
        pfVar40 = haarResponseX;
        pfVar50 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar32 + -1 + scale;
        iVar46 = iVar37 * iVar34;
        iVar45 = iVar37 * iVar17;
        fVar64 = pfVar3[iVar45 + -1 + iVar32];
        fVar6 = pfVar3[iVar46 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar43] - pfVar3[iVar45 + iVar43]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar36] -
                                                pfVar3[iVar46 + -1 + iVar32])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar37 * iVar27 + -1 + iVar32] -
                                                pfVar3[iVar37 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar36] -
                                                pfVar3[iVar46 + -1 + iVar32])));
        *pfVar35 = (fVar64 - fVar6) + auVar51._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar64 - fVar6);
      }
      pfVar35 = (float *)((long)pfVar40 + lVar29 + 4);
      pfVar1 = (float *)((long)pfVar50 + lVar29 + 4);
      iVar32 = (int)((double)((ulong)(0.0 <= fVar79) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar79) * -0x4020000000000000) + (double)fVar79);
      if (((iVar18 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar24 || (iVar36 = iVar2 + iVar32, iVar39 < iVar36)))) {
        haarXY(iimage,iVar18,iVar32,scale,pfVar35,pfVar1);
        iVar39 = iimage->width;
        pfVar40 = haarResponseX;
        pfVar50 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar45 = iVar32 + -1 + scale;
        iVar43 = iVar37 * iVar25;
        iVar46 = iVar37 * iVar19;
        fVar64 = pfVar3[iVar46 + -1 + iVar32];
        fVar79 = pfVar3[iVar43 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 + iVar45] - pfVar3[iVar46 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar36] -
                                                pfVar3[iVar43 + -1 + iVar32])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar37 * iVar26 + -1 + iVar32] -
                                                pfVar3[iVar37 * iVar26 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar36] -
                                                pfVar3[iVar43 + -1 + iVar32])));
        *pfVar35 = (fVar64 - fVar79) + auVar51._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar64 - fVar79);
      }
      pfVar35 = (float *)((long)pfVar40 + lVar29 + 100);
      pfVar1 = (float *)((long)pfVar50 + lVar29 + 100);
      if ((((iVar16 < 1) || (iVar32 < 1)) || (iimage->height < iVar20)) ||
         (iVar36 = iVar2 + iVar32, iVar39 < iVar36)) {
        haarXY(iimage,iVar16,iVar32,scale,pfVar35,pfVar1);
        iVar39 = iimage->width;
        pfVar40 = haarResponseX;
        pfVar50 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar32 + -1 + scale;
        iVar46 = iVar37 * iVar34;
        iVar45 = iVar37 * iVar17;
        fVar64 = pfVar3[iVar45 + -1 + iVar32];
        fVar79 = pfVar3[iVar46 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar43] - pfVar3[iVar45 + iVar43]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar36] -
                                                pfVar3[iVar46 + -1 + iVar32])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar37 * iVar27 + -1 + iVar32] -
                                                pfVar3[iVar37 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar36] -
                                                pfVar3[iVar46 + -1 + iVar32])));
        *pfVar35 = (fVar64 - fVar79) + auVar51._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar64 - fVar79);
      }
      pfVar35 = (float *)((long)pfVar40 + lVar29 + 8);
      pfVar1 = (float *)((long)pfVar50 + lVar29 + 8);
      iVar32 = (int)((double)((ulong)(0.0 <= fVar73) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar73) * -0x4020000000000000) + (double)fVar73);
      if (((iVar18 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar24 || (iVar36 = iVar2 + iVar32, iVar39 < iVar36)))) {
        haarXY(iimage,iVar18,iVar32,scale,pfVar35,pfVar1);
        iVar39 = iimage->width;
        pfVar40 = haarResponseX;
        pfVar50 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar45 = iVar32 + -1 + scale;
        iVar43 = iVar37 * iVar25;
        iVar46 = iVar37 * iVar19;
        fVar64 = pfVar3[iVar46 + -1 + iVar32];
        fVar73 = pfVar3[iVar43 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 + iVar45] - pfVar3[iVar46 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar36] -
                                                pfVar3[iVar43 + -1 + iVar32])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar37 * iVar26 + -1 + iVar32] -
                                                pfVar3[iVar37 * iVar26 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar36] -
                                                pfVar3[iVar43 + -1 + iVar32])));
        *pfVar35 = (fVar64 - fVar73) + auVar51._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar64 - fVar73);
      }
      pfVar35 = (float *)((long)pfVar40 + lVar29 + 0x68);
      pfVar1 = (float *)((long)pfVar50 + lVar29 + 0x68);
      if (((iVar16 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar20 || (iVar36 = iVar2 + iVar32, iVar39 < iVar36)))) {
        haarXY(iimage,iVar16,iVar32,scale,pfVar35,pfVar1);
        iVar39 = iimage->width;
        pfVar40 = haarResponseX;
        pfVar50 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar32 + -1 + scale;
        iVar46 = iVar37 * iVar34;
        iVar45 = iVar37 * iVar17;
        fVar64 = pfVar3[iVar45 + -1 + iVar32];
        fVar73 = pfVar3[iVar46 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar43] - pfVar3[iVar45 + iVar43]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar36] -
                                                pfVar3[iVar46 + -1 + iVar32])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar37 * iVar27 + -1 + iVar32] -
                                                pfVar3[iVar37 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar36] -
                                                pfVar3[iVar46 + -1 + iVar32])));
        *pfVar35 = (fVar64 - fVar73) + auVar51._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar64 - fVar73);
      }
      pfVar35 = (float *)((long)pfVar40 + lVar29 + 0xc);
      pfVar1 = (float *)((long)pfVar50 + lVar29 + 0xc);
      iVar32 = (int)((double)((ulong)(0.0 <= fVar67) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar67) * -0x4020000000000000) + (double)fVar67);
      if ((((iVar18 < 1) || (iVar32 < 1)) || (iimage->height < iVar24)) ||
         (iVar36 = iVar2 + iVar32, iVar39 < iVar36)) {
        haarXY(iimage,iVar18,iVar32,scale,pfVar35,pfVar1);
        iVar39 = iimage->width;
        pfVar40 = haarResponseX;
        pfVar50 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar45 = iVar32 + -1 + scale;
        iVar43 = iVar37 * iVar25;
        iVar46 = iVar37 * iVar19;
        fVar64 = pfVar3[iVar46 + -1 + iVar32];
        fVar67 = pfVar3[iVar43 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 + iVar45] - pfVar3[iVar46 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar36] -
                                                pfVar3[iVar43 + -1 + iVar32])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar37 * iVar26 + -1 + iVar32] -
                                                pfVar3[iVar37 * iVar26 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar36] -
                                                pfVar3[iVar43 + -1 + iVar32])));
        *pfVar35 = (fVar64 - fVar67) + auVar51._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar64 - fVar67);
      }
      pfVar35 = (float *)((long)pfVar40 + lVar29 + 0x6c);
      pfVar1 = (float *)((long)pfVar50 + lVar29 + 0x6c);
      if (((iVar16 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar20 || (iVar36 = iVar2 + iVar32, iVar39 < iVar36)))) {
        haarXY(iimage,iVar16,iVar32,scale,pfVar35,pfVar1);
        pfVar40 = haarResponseX;
        pfVar50 = haarResponseY;
      }
      else {
        iVar39 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar37 = iVar32 + -1 + scale;
        iVar45 = iVar39 * iVar34;
        iVar43 = iVar39 * iVar17;
        fVar64 = pfVar3[iVar43 + -1 + iVar32];
        fVar67 = pfVar3[iVar45 + -1 + iVar36];
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 + iVar37] - pfVar3[iVar43 + iVar37]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar36] -
                                                pfVar3[iVar45 + -1 + iVar32])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar39 * iVar27 + -1 + iVar32] -
                                                pfVar3[iVar39 * iVar27 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar36] -
                                                pfVar3[iVar45 + -1 + iVar32])));
        *pfVar35 = (fVar64 - fVar67) + auVar51._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar64 - fVar67);
      }
      auVar90 = ZEXT1664(auVar52);
      lVar29 = lVar29 + 0x10;
      bVar4 = iVar49 < 8;
      iVar49 = iVar49 + 4;
    } while (bVar4);
    lVar30 = lVar30 + 0xc0;
    bVar4 = (int)uVar21 < 10;
    uVar21 = uVar21 + 2;
  } while (bVar4);
LAB_001b627e:
  fVar89 = auVar90._0_4_;
  auVar88._8_4_ = 0x3effffff;
  auVar88._0_8_ = 0x3effffff3effffff;
  auVar88._12_4_ = 0x3effffff;
  auVar87._8_4_ = 0x80000000;
  auVar87._0_8_ = 0x8000000080000000;
  auVar87._12_4_ = 0x80000000;
  auVar51 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 0.5)),auVar87,0xf8);
  auVar51 = ZEXT416((uint)(fVar89 * 0.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 1.5)),auVar87,0xf8);
  auVar52 = ZEXT416((uint)(fVar89 * 1.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 2.5)),auVar87,0xf8);
  auVar53 = ZEXT416((uint)(fVar89 * 2.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 3.5)),auVar87,0xf8);
  auVar54 = ZEXT416((uint)(fVar89 * 3.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 4.5)),auVar87,0xf8);
  auVar55 = ZEXT416((uint)(fVar89 * 4.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 5.5)),auVar87,0xf8);
  auVar56 = ZEXT416((uint)(fVar89 * 5.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 6.5)),auVar87,0xf8);
  auVar57 = ZEXT416((uint)(fVar89 * 6.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 7.5)),auVar87,0xf8);
  auVar58 = ZEXT416((uint)(auVar58._0_4_ + fVar89 * 7.5));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 8.5)),auVar87,0xf8);
  auVar59 = ZEXT416((uint)(fVar89 * 8.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 9.5)),auVar87,0xf8);
  auVar60 = ZEXT416((uint)(fVar89 * 9.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 10.5)),auVar87,0xf8);
  auVar61 = ZEXT416((uint)(fVar89 * 10.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 11.5)),auVar87,0xf8);
  fVar70 = auVar53._0_4_;
  fVar64 = fVar70 + auVar52._0_4_;
  fVar5 = fVar70 + auVar51._0_4_;
  auVar53 = ZEXT416((uint)(fVar89 * 11.5 + auVar62._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  fVar89 = fVar70 - auVar51._0_4_;
  fVar67 = fVar70 - auVar52._0_4_;
  fVar73 = fVar70 - auVar54._0_4_;
  fVar79 = fVar70 - auVar55._0_4_;
  fVar6 = fVar70 - auVar56._0_4_;
  fVar70 = fVar70 - auVar57._0_4_;
  fVar84 = auVar58._0_4_;
  fVar7 = fVar84 - auVar54._0_4_;
  fVar8 = fVar84 - auVar55._0_4_;
  fVar9 = fVar84 - auVar56._0_4_;
  fVar10 = fVar84 - auVar57._0_4_;
  fVar11 = fVar84 - auVar59._0_4_;
  fVar12 = fVar84 - auVar60._0_4_;
  fVar13 = fVar84 - auVar61._0_4_;
  fVar84 = fVar84 - auVar53._0_4_;
  gauss_s1_c0[0] = expf(fVar64 * fVar64 * fVar63);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar63);
  gauss_s1_c0[2] = expf(fVar89 * fVar89 * fVar63);
  gauss_s1_c0[3] = expf(fVar67 * fVar67 * fVar63);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar73 * fVar73 * fVar63);
  gauss_s1_c0[6] = expf(fVar79 * fVar79 * fVar63);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar63);
  gauss_s1_c0[8] = expf(fVar70 * fVar70 * fVar63);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar63);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar63);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar63);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar63);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar63);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar63);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar63);
  gauss_s1_c1[8] = expf(fVar84 * fVar84 * fVar63);
  auVar69._8_4_ = 0x7fffffff;
  auVar69._0_8_ = 0x7fffffff7fffffff;
  auVar69._12_4_ = 0x7fffffff;
  uVar22 = 0xfffffff8;
  fVar64 = 0.0;
  lVar30 = 0;
  lVar29 = 0;
  local_d0 = 0;
  do {
    pfVar40 = gauss_s1_c1;
    uVar21 = (uint)uVar22;
    if (uVar21 != 7) {
      pfVar40 = gauss_s1_c0;
    }
    lVar47 = (long)local_d0;
    lVar29 = (long)(int)lVar29;
    if (uVar21 == 0xfffffff8) {
      pfVar40 = gauss_s1_c1;
    }
    uVar44 = 0;
    local_d0 = local_d0 + 4;
    uVar38 = 0xfffffff8;
    lVar41 = (long)haarResponseX + lVar30;
    lVar31 = (long)haarResponseY + lVar30;
    do {
      pfVar50 = gauss_s1_c1;
      if (uVar38 != 7) {
        pfVar50 = gauss_s1_c0;
      }
      auVar85 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar38 == 0xfffffff8) {
        pfVar50 = gauss_s1_c1;
      }
      uVar23 = (ulong)(uVar38 >> 0x1c & 0xfffffff8);
      uVar28 = uVar44;
      lVar33 = lVar31;
      lVar48 = lVar41;
      do {
        lVar42 = 0;
        pfVar35 = (float *)((long)pfVar40 + (ulong)(uint)((int)(uVar22 >> 0x1f) << 5));
        do {
          fVar5 = pfVar50[uVar23] * *pfVar35;
          pfVar35 = pfVar35 + (ulong)(~uVar21 >> 0x1f) * 2 + -1;
          auVar51 = vinsertps_avx(ZEXT416(*(uint *)(lVar33 + lVar42 * 4)),
                                  ZEXT416(*(uint *)(lVar48 + lVar42 * 4)),0x10);
          lVar42 = lVar42 + 1;
          auVar81._0_4_ = fVar5 * auVar51._0_4_;
          auVar81._4_4_ = fVar5 * auVar51._4_4_;
          auVar81._8_4_ = fVar5 * auVar51._8_4_;
          auVar81._12_4_ = fVar5 * auVar51._12_4_;
          auVar51 = vandps_avx(auVar81,auVar69);
          auVar51 = vmovlhps_avx(auVar81,auVar51);
          auVar72._0_4_ = auVar85._0_4_ + auVar51._0_4_;
          auVar72._4_4_ = auVar85._4_4_ + auVar51._4_4_;
          auVar72._8_4_ = auVar85._8_4_ + auVar51._8_4_;
          auVar72._12_4_ = auVar85._12_4_ + auVar51._12_4_;
          auVar85 = ZEXT1664(auVar72);
        } while (lVar42 != 9);
        uVar28 = uVar28 + 0x18;
        uVar23 = uVar23 + (ulong)(-1 < (int)uVar38) * 2 + -1;
        lVar48 = lVar48 + 0x60;
        lVar33 = lVar33 + 0x60;
      } while (uVar28 < uVar38 * 0x18 + 0x198);
      uVar38 = uVar38 + 5;
      uVar44 = uVar44 + 0x78;
      fVar5 = gauss_s2_arr[lVar47];
      auVar15._4_4_ = fVar5;
      auVar15._0_4_ = fVar5;
      auVar15._8_4_ = fVar5;
      auVar15._12_4_ = fVar5;
      auVar54 = vmulps_avx512vl(auVar72,auVar15);
      lVar47 = lVar47 + 1;
      auVar75._0_4_ = auVar54._0_4_ * auVar54._0_4_;
      auVar75._4_4_ = auVar54._4_4_ * auVar54._4_4_;
      auVar75._8_4_ = auVar54._8_4_ * auVar54._8_4_;
      auVar75._12_4_ = auVar54._12_4_ * auVar54._12_4_;
      auVar52 = vshufpd_avx(auVar54,auVar54,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar29) = auVar54;
      lVar29 = lVar29 + 4;
      lVar41 = lVar41 + 0x1e0;
      lVar31 = lVar31 + 0x1e0;
      auVar51 = vmovshdup_avx(auVar75);
      auVar53 = vfmadd231ss_fma(auVar51,auVar54,auVar54);
      auVar51 = vshufps_avx(auVar54,auVar54,0xff);
      auVar52 = vfmadd213ss_fma(auVar52,auVar52,auVar53);
      auVar51 = vfmadd213ss_fma(auVar51,auVar51,auVar52);
      fVar64 = fVar64 + auVar51._0_4_;
    } while (local_d0 != (int)lVar47);
    lVar30 = lVar30 + 0x14;
    uVar22 = (ulong)(uVar21 + 5);
  } while ((int)uVar21 < 3);
  if (fVar64 < 0.0) {
    fVar64 = sqrtf(fVar64);
  }
  else {
    auVar51 = vsqrtss_avx(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
    fVar64 = auVar51._0_4_;
  }
  lVar30 = 0;
  auVar85 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar64)));
  do {
    auVar90 = vmulps_avx512f(auVar85,*(undefined1 (*) [64])(ipoint->descriptor + lVar30));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar30) = auVar90;
    lVar30 = lVar30 + 0x10;
  } while (lVar30 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_4_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}